

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
CLI::getWords_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,CLI *this)

{
  pointer pAVar1;
  bool bVar2;
  string *this_00;
  pointer this_01;
  allocator<char> local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = (this->_args).super__Vector_base<A2,_std::allocator<A2>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar1 = (this->_args).super__Vector_base<A2,_std::allocator<A2>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  local_b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  do {
    if (this_01 == pAVar1) {
      return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"BINARY",&local_b9);
    bVar2 = A2::hasTag(this_01,&local_70);
    this_00 = &local_70;
    if (bVar2) {
LAB_0010ff3d:
      std::__cxx11::string::~string((string *)this_00);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"CMD",&local_ba);
      bVar2 = A2::hasTag(this_01,&local_90);
      if (bVar2) {
LAB_0010ff32:
        std::__cxx11::string::~string((string *)&local_90);
        goto LAB_0010ff3d;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"CONFIG",&local_bb);
      bVar2 = A2::hasTag(this_01,&local_b0);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_b0);
        goto LAB_0010ff32;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"HINT",&local_bc);
      bVar2 = A2::hasTag(this_01,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      if (!bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"raw",(allocator<char> *)&local_b0);
        A2::attribute(&local_70,this_01,&local_90);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_b8,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = &local_90;
        goto LAB_0010ff3d;
      }
    }
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

std::string A2::getToken () const
{
  auto i = _attributes.find ("canonical");
  if (i == _attributes.end ())
    i = _attributes.find ("raw");

  return i->second;
}